

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O0

Vec_Int_t * Vec_IntInvert(Vec_Int_t *p,int Fill)

{
  int iVar1;
  Vec_Int_t *p_00;
  Vec_Int_t *vRes;
  int i;
  int Entry;
  int Fill_local;
  Vec_Int_t *p_local;
  
  p_00 = Vec_IntAlloc(0);
  iVar1 = Vec_IntSize(p);
  if (iVar1 != 0) {
    iVar1 = Vec_IntFindMax(p);
    Vec_IntFill(p_00,iVar1 + 1,Fill);
    for (vRes._4_4_ = 0; iVar1 = Vec_IntSize(p), vRes._4_4_ < iVar1; vRes._4_4_ = vRes._4_4_ + 1) {
      iVar1 = Vec_IntEntry(p,vRes._4_4_);
      if (iVar1 != Fill) {
        Vec_IntWriteEntry(p_00,iVar1,vRes._4_4_);
      }
    }
  }
  return p_00;
}

Assistant:

static inline Vec_Int_t * Vec_IntInvert( Vec_Int_t * p, int Fill ) 
{
    int Entry, i;
    Vec_Int_t * vRes = Vec_IntAlloc( 0 );
    if ( Vec_IntSize(p) == 0 )
        return vRes;
    Vec_IntFill( vRes, Vec_IntFindMax(p) + 1, Fill );
    Vec_IntForEachEntry( p, Entry, i )
        if ( Entry != Fill )
            Vec_IntWriteEntry( vRes, Entry, i );
    return vRes;
}